

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O3

PCRE2_SPTR8 set_table_bit(pcre2_real_code_8 *re,PCRE2_SPTR8 p,BOOL caseless,BOOL utf)

{
  byte bVar1;
  undefined8 in_RAX;
  uint uVar2;
  PCRE2_SPTR8 pPVar3;
  ulong uVar4;
  byte local_26 [8];
  PCRE2_UCHAR8 buff [6];
  
  local_26[0] = (byte)((ulong)in_RAX >> 0x10);
  bVar1 = *p;
  uVar4 = (ulong)bVar1;
  uVar2 = bVar1 & 7;
  re->start_bitmap[bVar1 >> 3] = re->start_bitmap[bVar1 >> 3] | (byte)(1 << (sbyte)uVar2);
  if (utf == 0 || bVar1 < 0xc0) {
    pPVar3 = p + 1;
  }
  else if ((bVar1 & 0x20) == 0) {
    pPVar3 = p + 2;
    uVar4 = (ulong)((bVar1 & 0x1f) << 6 | p[1] & 0x3f);
  }
  else if ((bVar1 & 0x10) == 0) {
    uVar4 = (ulong)(p[2] & 0x3f | (p[1] & 0x3f) << 6 | (bVar1 & 0xf) << 0xc);
    pPVar3 = p + 3;
  }
  else if ((bVar1 & 8) == 0) {
    uVar4 = (ulong)(p[3] & 0x3f | (p[2] & 0x3f) << 6 | (p[1] & 0x3f) << 0xc | uVar2 << 0x12);
    pPVar3 = p + 4;
  }
  else if ((bVar1 & 4) == 0) {
    pPVar3 = p + 5;
    uVar4 = (ulong)((p[3] & 0x3f) << 6 |
                    (p[2] & 0x3f) << 0xc | (p[1] & 0x3f) << 0x12 | (bVar1 & 3) << 0x18 | p[4] & 0x3f
                   );
  }
  else {
    uVar4 = (ulong)(p[5] & 0x3f |
                   (p[4] & 0x3f) << 6 |
                   (p[3] & 0x3f) << 0xc |
                   (p[2] & 0x3f) << 0x12 | (p[1] & 0x3f) << 0x18 | (bVar1 & 1) << 0x1e);
    pPVar3 = p + 6;
  }
  if (caseless != 0) {
    if (utf == 0) {
      local_26[0] = re->tables[uVar4 + 0x100];
    }
    else {
      _pcre2_ord2utf_8((uint)uVar4 +
                       _pcre2_ucd_records_8
                       [*(ushort *)
                         ((long)_pcre2_ucd_stage2_8 +
                         (ulong)((uint)""[uVar4 >> 7] * 0x100 + ((uint)uVar4 & 0x7f) * 2))].
                       other_case,local_26);
    }
    re->start_bitmap[local_26[0] >> 3] =
         re->start_bitmap[local_26[0] >> 3] | '\x01' << (local_26[0] & 7);
  }
  return pPVar3;
}

Assistant:

static PCRE2_SPTR
set_table_bit(pcre2_real_code *re, PCRE2_SPTR p, BOOL caseless, BOOL utf)
{
uint32_t c = *p++;   /* First code unit */
(void)utf;           /* Stop compiler warning when UTF not supported */

/* In 16-bit and 32-bit modes, code units greater than 0xff set the bit for
0xff. */

#if PCRE2_CODE_UNIT_WIDTH != 8
if (c > 0xff) SET_BIT(0xff); else
#endif

SET_BIT(c);

/* In UTF-8 or UTF-16 mode, pick up the remaining code units in order to find
the end of the character, even when caseless. */

#ifdef SUPPORT_UNICODE
if (utf)
  {
#if PCRE2_CODE_UNIT_WIDTH == 8
  if (c >= 0xc0) GETUTF8INC(c, p);
#elif PCRE2_CODE_UNIT_WIDTH == 16
  if ((c & 0xfc00) == 0xd800) GETUTF16INC(c, p);
#endif
  }
#endif  /* SUPPORT_UNICODE */

/* If caseless, handle the other case of the character. */

if (caseless)
  {
  if (utf)
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    PCRE2_UCHAR buff[6];
    c = UCD_OTHERCASE(c);
    (void)PRIV(ord2utf)(c, buff);
    SET_BIT(buff[0]);
#else  /* 16-bit or 32-bit mode */
    c = UCD_OTHERCASE(c);
    if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
#endif
    }

  /* Not UTF */

  else if (MAX_255(c)) SET_BIT(re->tables[fcc_offset + c]);
  }

return p;
}